

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

float __thiscall ON_4fPoint::operator[](ON_4fPoint *this,uint i)

{
  if (i != 0) {
    if (i < 3) {
      if (i == 1) {
        this = (ON_4fPoint *)&this->y;
      }
      else {
        this = (ON_4fPoint *)&this->z;
      }
    }
    else {
      this = (ON_4fPoint *)&this->w;
    }
  }
  return this->x;
}

Assistant:

float ON_4fPoint::operator[](unsigned int i) const
{
  return ((i<=0)?x:((i>=3)?w:((i==1)?y:z)));
}